

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O2

bool __thiscall M_tree::compare(M_tree *this)

{
  Node *__x;
  Node *__y;
  bool bVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  ostream *poVar3;
  undefined8 extraout_RAX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  M_tree *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  differ;
  string rm_head;
  string cp_head;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&cp_head,"cp ",(allocator *)&rm_head);
  this_00 = (M_tree *)&rm_head;
  std::__cxx11::string::string((string *)this_00,"rm ",(allocator *)&item);
  __x = this->pNode;
  __y = this->ofolder;
  bVar1 = hash_cmp(this_00,__x->hashn,__y->hashn);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&rm_head);
    std::__cxx11::string::~string((string *)&cp_head);
    return true;
  }
  bVar1 = std::operator!=(&__x->key,&__y->key);
  if (bVar1) {
    uVar4 = (ulong)((long)(this->pNode->key).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->pNode->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5;
    uVar6 = 0;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 << 5 != uVar6; uVar6 = uVar6 + 0x20) {
      std::__cxx11::string::string
                ((string *)&item,
                 (string *)
                 ((long)&(((this->pNode->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar6));
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((this->ofolder->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->ofolder->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&item);
      if (_Var2._M_current ==
          (this->ofolder->key).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        poVar3 = std::operator<<((ostream *)&std::cout,"File: ");
        poVar3 = std::operator<<(poVar3,(string *)&item);
        poVar3 = std::operator<<(poVar3," are lost. We are copying");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&differ,
                       &this->folder_name1,"/");
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&differ,
                       &item);
        std::operator+(&local_b0,&local_50," ");
        std::operator+(&local_70,&local_b0,&this->folder_name2);
        std::__cxx11::string::append((string *)&cp_head);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&differ);
        system(cp_head._M_dataplus._M_p);
        std::__cxx11::string::string((string *)&local_70,"cp ",(allocator *)&local_b0);
        std::__cxx11::string::operator=((string *)&cp_head,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::~string((string *)&item);
    }
    uVar4 = (ulong)((long)(this->ofolder->key).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->ofolder->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5;
    uVar6 = 0;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 * 0x20 != uVar6; uVar6 = uVar6 + 0x20) {
      std::__cxx11::string::string
                ((string *)&item,
                 (string *)
                 ((long)&(((this->ofolder->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar6));
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((this->pNode->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->pNode->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&item);
      if (_Var2._M_current ==
          (this->pNode->key).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        poVar3 = std::operator<<((ostream *)&std::cout,"File: ");
        poVar3 = std::operator<<(poVar3,(string *)&item);
        poVar3 = std::operator<<(poVar3," are redundant. We are deleting");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::operator+(&local_b0,&this->folder_name2,"/");
        std::operator+(&local_70,&local_b0,&item);
        std::__cxx11::string::append((string *)&rm_head);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
        system(rm_head._M_dataplus._M_p);
        std::__cxx11::string::string((string *)&local_70,"rm ",(allocator *)&local_b0);
        std::__cxx11::string::operator=((string *)&rm_head,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::~string((string *)&item);
    }
    build(this,(this->folder_name2)._M_dataplus._M_p,3);
  }
  compare_tree_abi_cxx11_(&differ,this,this->pNode,this->ofolder);
  std::operator<<((ostream *)&std::cout,"Wrong files:\n");
  while (differ.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         differ.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             (string *)
                             (differ.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1));
    poVar3 = std::operator<<(poVar3," is wrong. We are fixing it...");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator+(&local_70,&this->folder_name2,"/");
    std::operator+(&item,&local_70,
                   differ.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::__cxx11::string::append((string *)&rm_head);
    std::__cxx11::string::~string((string *)&item);
    std::__cxx11::string::~string((string *)&local_70);
    system(rm_head._M_dataplus._M_p);
    std::__cxx11::string::string((string *)&item,"rm ",(allocator *)&local_70);
    std::__cxx11::string::operator=((string *)&rm_head,(string *)&item);
    std::__cxx11::string::~string((string *)&item);
    std::operator+(&local_50,&this->folder_name1,"/");
    std::operator+(&local_b0,&local_50,
                   differ.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::operator+(&local_70,&local_b0," ");
    std::operator+(&item,&local_70,&this->folder_name2);
    std::__cxx11::string::append((string *)&cp_head);
    std::__cxx11::string::~string((string *)&item);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    system(cp_head._M_dataplus._M_p);
    std::__cxx11::string::string((string *)&item,"cp ",(allocator *)&local_70);
    std::__cxx11::string::operator=((string *)&cp_head,(string *)&item);
    std::__cxx11::string::~string((string *)&item);
    differ.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         differ.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::__cxx11::string::~string
              ((string *)
               differ.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&differ);
  std::__cxx11::string::~string((string *)&item);
  std::__cxx11::string::~string((string *)&rm_head);
  std::__cxx11::string::~string((string *)&cp_head);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

bool M_tree::compare() {
    string cp_head = string("cp ");
    string rm_head = string("rm ");
    if(hash_cmp(this->pNode->hashn, this->ofolder->hashn)){
        return true;
    }else{
        if(this->pNode->key != this->ofolder->key){
            int n = this->pNode->key.size();
            int i;
            vector<string>::iterator it;
            for(i=0;i<n;i++){
                string item = this->pNode->key[i];
                it = find(this->ofolder->key.begin(), this->ofolder->key.end(), item);
                if(it == this->ofolder->key.end()){
                    //the file is not in fold2
                    cout << "File: " << item << " are lost. We are copying" << endl;
                    cp_head += folder_name1 + "/" + item + " " + folder_name2;
                    system(cp_head.c_str());
                    cp_head = string("cp ");
                }
            }
            n = this->ofolder->key.size();
            for(i = 0;i<n;i++){
                string item = this->ofolder->key[i];
                it = find(this->pNode->key.begin(), this->pNode->key.end(), item);
                if(it == this->pNode->key.end()){
                    //the file need to be deleted
                    cout << "File: " << item << " are redundant. We are deleting" << endl;
                    rm_head += folder_name2 + "/" + item;
                    system(rm_head.c_str());
                    rm_head = string("rm ");
                }
            }
            this->build(const_cast<char *>(folder_name2.c_str()), 3);
        }
        if(!hash_cmp(this->pNode->hashn, this->ofolder->hashn)){
            vector<string> differ(M_tree::compare_tree(this->pNode, this->ofolder));
            cout << "Wrong files:\n";
            while(!differ.empty()){
                cout << differ.back() << " is wrong. We are fixing it..." << endl;
                rm_head += this->folder_name2 + "/" + differ.back();
                system(rm_head.c_str());
                rm_head = string("rm ");
                cp_head += this->folder_name1 + "/" + differ.back() + " " + folder_name2;
                system(cp_head.c_str());
                cp_head = string("cp ");
                differ.pop_back();
            }
        }
    }
}